

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool ProcessMantissaDigit(char ch,int64_t *mantissa,int *mantissa_tzeros)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000039;
  int64_t iVar4;
  int i;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *mantissa_tzeros;
  if (ch == '0') {
    iVar3 = iVar3 + 1;
  }
  else {
    iVar4 = *mantissa;
    for (iVar5 = 0; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
      if (99999999999999999 < iVar4) {
        bVar2 = false;
        goto LAB_00b08f04;
      }
      iVar4 = iVar4 * 10;
      *mantissa = iVar4;
    }
    *mantissa = (int)CONCAT71(in_register_00000039,ch) + iVar4 + -0x30;
    iVar3 = 0;
  }
  *mantissa_tzeros = iVar3;
  bVar2 = true;
LAB_00b08f04:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool ProcessMantissaDigit(char ch, int64_t &mantissa, int &mantissa_tzeros)
{
    if(ch == '0')
        ++mantissa_tzeros;
    else {
        for (int i=0; i<=mantissa_tzeros; ++i) {
            if (mantissa > (UPPER_BOUND / 10LL))
                return false; /* overflow */
            mantissa *= 10;
        }
        mantissa += ch - '0';
        mantissa_tzeros = 0;
    }
    return true;
}